

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void error_handler_cb(exr_const_context_t f,int code,char *msg)

{
  FILE *__stream;
  char *pcVar1;
  int iVar2;
  char *in_RAX;
  undefined8 uVar3;
  char *fn;
  char *local_28;
  
  local_28 = in_RAX;
  iVar2 = exr_get_file_name(f,&local_28);
  __stream = _stderr;
  if (iVar2 != 0) {
    local_28 = "<error>";
  }
  pcVar1 = local_28;
  uVar3 = exr_get_error_code_as_string(code);
  fprintf(__stream,"ERROR \'%s\' (%s): %s\n",pcVar1,uVar3,msg);
  return;
}

Assistant:

static void
error_handler_cb (exr_const_context_t f, int code, const char* msg)
{
    const char* fn;
    if (EXR_ERR_SUCCESS != exr_get_file_name (f, &fn)) fn = "<error>";
    fprintf (
        stderr,
        "ERROR '%s' (%s): %s\n",
        fn,
        exr_get_error_code_as_string (code),
        msg);
}